

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

box_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
::
box_from_bounds<pico_tree::internal::space_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,std::array<float,3ul>>
          (box_type *__return_storage_ptr__,void *this,
          space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          space,bounds_t<std::array<float,_3UL>_> *bounds)

{
  box_base<pico_tree::internal::box<float,_3UL>_>::fill_inverse_max
            ((box_base<pico_tree::internal::box<float,_3UL>_> *)__return_storage_ptr__);
  box_base<pico_tree::internal::box<float,_3UL>_>::fit
            ((box_base<pico_tree::internal::box<float,_3UL>_> *)__return_storage_ptr__,
             (scalar_type *)bounds);
  box_base<pico_tree::internal::box<float,_3UL>_>::fit
            ((box_base<pico_tree::internal::box<float,_3UL>_> *)__return_storage_ptr__,
             (bounds->max_)._M_elems);
  return __return_storage_ptr__;
}

Assistant:

box_type box_from_bounds(
      SpaceWrapper_ space, bounds_t<Point_> const& bounds) const {
    internal::point_wrapper<Point_> min(bounds.min());
    internal::point_wrapper<Point_> max(bounds.max());
    box_type bbox = box_type::make_inverse_max(space.sdim());
    bbox.fit(min.begin());
    bbox.fit(max.begin());
    return bbox;
  }